

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkDirFrame::ConstraintsBiLoad_C
          (ChLinkDirFrame *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChVector<double> res;
  ChMatrix33<double> Arw;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_88;
  ChQuaternion<double> local_80;
  ChMatrix33<double> local_60;
  
  ChQuaternion<double>::operator>>
            (&local_80,&(this->m_csys).rot,
             &(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  ChMatrix33<double>::Set_A_quaternion(&local_60,&local_80);
  local_88.m_matrix = &local_60.super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_88,
                    (ChVector<double> *)
                    &(((this->m_node).
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_ChNodeFEAxyz).field_0xf0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_80.m_data[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = factor;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->constraint1).super_ChConstraintTwo.super_ChConstraint.b_i;
  auVar1 = vfmadd213sd_fma(auVar3,auVar5,auVar1);
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.b_i = auVar1._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_80.m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->constraint2).super_ChConstraintTwo.super_ChConstraint.b_i;
  auVar1 = vfmadd213sd_fma(auVar4,auVar5,auVar2);
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.b_i = auVar1._0_8_;
  return;
}

Assistant:

void ChLinkDirFrame::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    // if (!IsActive())
    //	return;

    ChMatrix33<> Arw = m_csys.rot >> m_body->coord.rot;
    ChVector<> res = Arw.transpose() * m_node->GetD();

    constraint1.Set_b_i(constraint1.Get_b_i() + factor * res.y());
    constraint2.Set_b_i(constraint2.Get_b_i() + factor * res.z());
}